

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O1

void * array_size_new(t_symbol *s,int argc,t_atom *argv)

{
  char *__s1;
  int iVar1;
  t_object *owner;
  _inlet *p_Var2;
  _gobj **gp;
  
  owner = (t_object *)pd_new(array_size_class);
  owner[1].te_g.g_pd = (t_pd)0x0;
  owner[1].te_inlet = (_inlet *)0x0;
  owner[1].te_xpix = 0;
  owner[1].te_ypix = 0;
  owner[1].te_width = 0;
  *(undefined2 *)&owner[1].field_0x2e = 0;
  gp = &owner[1].te_g.g_next;
  gpointer_init((t_gpointer *)gp);
  if (argc == 0) {
    argc = 0;
  }
  else {
    do {
      if (argv->a_type != A_SYMBOL) goto LAB_0017bd9c;
      __s1 = ((argv->a_w).w_symbol)->s_name;
      if (*__s1 != '-') {
        if (owner[1].te_inlet == (_inlet *)0x0) {
          *(word *)(owner + 1) = argv->a_w;
        }
        else {
          pd_error(owner,"array setline: extra names after -s..");
          postatom(argc,argv);
          endpost();
        }
        argc = argc + -1;
        argv = argv + 1;
        goto LAB_0017bd9c;
      }
      iVar1 = strcmp(__s1,"-s");
      if ((((argc < 3) || (iVar1 != 0)) || (argv[1].a_type != A_SYMBOL)) ||
         (argv[2].a_type != A_SYMBOL)) {
        pd_error(owner,"array setline: unknown flag ...");
        postatom(argc,argv);
        endpost();
      }
      else {
        p_Var2 = (_inlet *)canvas_makebindsym(argv[1].a_w.w_symbol);
        owner[1].te_inlet = p_Var2;
        *(word *)&owner[1].te_xpix = argv[2].a_w;
        argc = argc + -2;
        argv = argv + 2;
      }
      argv = argv + 1;
      argc = argc + -1;
    } while (argc != 0);
    argc = 0;
  }
LAB_0017bd9c:
  if (argc != 0) {
    post("warning: array setline ignoring extra argument: ");
    postatom(argc,argv);
    endpost();
  }
  if (owner[1].te_inlet == (_inlet *)0x0) {
    symbolinlet_new(owner,&((word *)(owner + 1))->w_symbol);
  }
  else {
    pointerinlet_new(owner,(t_gpointer *)gp);
  }
  outlet_new(owner,&s_float);
  return owner;
}

Assistant:

static void *array_size_new(t_symbol *s, int argc, t_atom *argv)
{
    t_array_size *x = (t_array_size *)pd_new(array_size_class);
    x->x_sym = x->x_struct = x->x_field = 0;
    gpointer_init(&x->x_gp);
    while (argc && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        if (!strcmp(argv->a_w.w_symbol->s_name, "-s") &&
            argc >= 3 && argv[1].a_type == A_SYMBOL &&
                argv[2].a_type == A_SYMBOL)
        {
            x->x_struct = canvas_makebindsym(argv[1].a_w.w_symbol);
            x->x_field = argv[2].a_w.w_symbol;
            argc -= 2; argv += 2;
        }
        else
        {
            pd_error(x, "array setline: unknown flag ...");
            postatom(argc, argv); endpost();
        }
        argc--; argv++;
    }
    if (argc && argv->a_type == A_SYMBOL)
    {
        if (x->x_struct)
        {
            pd_error(x, "array setline: extra names after -s..");
            postatom(argc, argv); endpost();
        }
        else x->x_sym = argv->a_w.w_symbol;
        argc--; argv++;
    }
    if (argc)
    {
        post("warning: array setline ignoring extra argument: ");
        postatom(argc, argv); endpost();
    }
    if (x->x_struct)
        pointerinlet_new(&x->x_tc.tc_obj, &x->x_gp);
    else symbolinlet_new(&x->x_tc.tc_obj, &x->x_tc.tc_sym);
    outlet_new(&x->x_tc.tc_obj, &s_float);
    return (x);
}